

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O3

size_t Assimp::WriteBounds<aiVectorKey>(IOStream *stream,aiVectorKey *in,uint size)

{
  float fVar1;
  double dVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double local_60;
  undefined8 local_58;
  float local_50 [2];
  double local_48;
  undefined8 local_40;
  float local_38 [2];
  
  local_60 = -10000000000.0;
  local_48 = 10000000000.0;
  local_58 = 0xd01502f9d01502f9;
  local_50[0] = -1e+10;
  local_40 = 0x501502f9501502f9;
  local_38[0] = 1e+10;
  if (size != 0) {
    local_48 = 10000000000.0;
    local_38[0] = 1e+10;
    local_60 = -10000000000.0;
    local_50[0] = -1e+10;
    lVar6 = 0;
    auVar7 = _DAT_007389b0;
    auVar8 = _DAT_007389a0;
    do {
      dVar2 = *(double *)((long)&in->mTime + lVar6);
      if (dVar2 <= local_48) {
        local_48 = dVar2;
      }
      fVar1 = *(float *)((long)&(in->mValue).z + lVar6);
      if (fVar1 <= local_38[0]) {
        local_38[0] = fVar1;
      }
      if (local_60 <= dVar2) {
        local_60 = dVar2;
      }
      uVar3 = *(ulong *)((long)&(in->mValue).x + lVar6);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar3;
      auVar8 = minps(auVar8,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar3;
      auVar7 = maxps(auVar7,auVar5);
      if (local_50[0] <= fVar1) {
        local_50[0] = fVar1;
      }
      lVar6 = lVar6 + 0x18;
    } while ((ulong)size * 0x18 != lVar6);
    local_40 = auVar8._0_8_;
    local_58 = auVar7._0_8_;
  }
  (*stream->_vptr_IOStream[3])(stream,&local_48,8,1);
  (*stream->_vptr_IOStream[3])(stream,&local_40,4,1);
  (*stream->_vptr_IOStream[3])(stream,(long)&local_40 + 4,4,1);
  (*stream->_vptr_IOStream[3])(stream,local_38,4,1);
  (*stream->_vptr_IOStream[3])(stream,&local_60,8,1);
  (*stream->_vptr_IOStream[3])(stream,&local_58,4,1);
  (*stream->_vptr_IOStream[3])(stream,(long)&local_58 + 4,4,1);
  (*stream->_vptr_IOStream[3])(stream,local_50,4,1);
  return 0x28;
}

Assistant:

inline
size_t WriteBounds(IOStream * stream, const T* in, unsigned int size) {
    T minc, maxc;
    ArrayBounds(in,size,minc,maxc);

    const size_t t = Write<T>(stream,minc);
    return t + Write<T>(stream,maxc);
}